

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

xmlChar * xmlXPathParseNameComplex(xmlXPathParserContextPtr ctxt,int qualified)

{
  uint val;
  uint uVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  xmlChar *pxVar5;
  xmlChar *pxVar6;
  uint len;
  bool bVar7;
  int l;
  xmlChar buf [105];
  int local_b0;
  int local_ac;
  xmlChar local_a8 [120];
  
  val = xmlXPathCurrentChar(ctxt,&local_b0);
  if ((val - 0x20 < 0x3e) && ((0x2800000140008401U >> ((ulong)(val - 0x20) & 0x3f) & 1) != 0)) {
    return (xmlChar *)0x0;
  }
  if (val < 0x100) {
    if ((((0x16 < val - 0xc0 && 0x19 < (val & 0xdf) - 0x41) && (val != 0x5f)) && (val < 0xf8)) &&
       ((0x1e < val - 0xd8 && (val != 0x3a || qualified == 0)))) {
      return (xmlChar *)0x0;
    }
  }
  else {
    iVar3 = xmlCharInRange(val,&xmlIsBaseCharGroup);
    if ((iVar3 == 0) && ((val - 0x302a < 0xfffffff7 && val - 0x9fa6 < 0xffffae5a) && val != 0x3007))
    {
      return (xmlChar *)0x0;
    }
  }
  len = 0;
  local_ac = qualified;
  do {
    if ((val < 0x3f) && ((0x4000800100000000U >> ((ulong)val & 0x3f) & 1) != 0)) {
LAB_001c45cb:
      if (len == 0) {
        return (xmlChar *)0x0;
      }
      pxVar5 = xmlStrndup(local_a8,len);
      if (pxVar5 != (xmlChar *)0x0) {
        return pxVar5;
      }
      goto LAB_001c4817;
    }
    if (val < 0x100) {
      if (val - 0xc0 < 0x17 || (val & 0xdf) - 0x41 < 0x1a) {
LAB_001c4496:
        if (val < 0x80) goto LAB_001c4546;
      }
      else if (val < 0xf8 && 0x1e < val - 0xd8) {
        if (9 < val - 0x30) goto LAB_001c452d;
        goto LAB_001c4546;
      }
LAB_001c450c:
      iVar3 = xmlCopyCharMultiByte(local_a8 + (int)len,val);
      len = len + iVar3;
    }
    else {
      iVar3 = xmlCharInRange(val,&xmlIsBaseCharGroup);
      if (((iVar3 != 0) || ((val - 0x3021 < 9 || val - 0x4e00 < 0x51a6) || val == 0x3007)) ||
         (iVar3 = xmlCharInRange(val,&xmlIsDigitGroup), iVar3 != 0)) goto LAB_001c450c;
LAB_001c452d:
      if (((0x32 < val - 0x2d) || ((0x4000000000003U >> ((ulong)(val - 0x2d) & 0x3f) & 1) == 0)) &&
         (local_ac == 0 || val != 0x3a)) {
        if (val < 0x100) {
          uVar1 = (uint)(val == 0xb7);
        }
        else {
          iVar3 = xmlCharInRange(val,&xmlIsCombiningGroup);
          if (iVar3 != 0) goto LAB_001c450c;
          uVar1 = xmlCharInRange(val,&xmlIsExtenderGroup);
        }
        if (uVar1 == 0) goto LAB_001c45cb;
        goto LAB_001c4496;
      }
LAB_001c4546:
      lVar4 = (long)(int)len;
      len = len + 1;
      local_a8[lVar4] = (xmlChar)val;
    }
    ctxt->cur = ctxt->cur + local_b0;
    val = xmlXPathCurrentChar(ctxt,&local_b0);
  } while ((int)len < 100);
  if (50000 < len) {
    xmlXPathErr(ctxt,7);
    return (xmlChar *)0x0;
  }
  uVar1 = len * 2;
  pxVar5 = (xmlChar *)(*xmlMalloc)((size_t)uVar1);
  if (pxVar5 != (xmlChar *)0x0) {
    memcpy(pxVar5,local_a8,(ulong)len);
    do {
      if (val < 0x100) {
        if ((0x16 < val - 0xc0 && 0x19 < (val & 0xdf) - 0x41) &&
           ((9 < val - 0x30 && 0x1e < val - 0xd8) && val < 0xf8)) {
LAB_001c46e2:
          if (((0x32 < val - 0x2d) || ((0x4000000000003U >> ((ulong)(val - 0x2d) & 0x3f) & 1) == 0))
             && (local_ac == 0 || val != 0x3a)) {
            if (val < 0x100) {
              uVar2 = (uint)(val == 0xb7);
            }
            else {
              iVar3 = xmlCharInRange(val,&xmlIsCombiningGroup);
              if (iVar3 != 0) goto LAB_001c4703;
              uVar2 = xmlCharInRange(val,&xmlIsExtenderGroup);
            }
            if (uVar2 == 0) {
              pxVar5[(int)len] = '\0';
              return pxVar5;
            }
          }
        }
      }
      else {
        iVar3 = xmlCharInRange(val,&xmlIsBaseCharGroup);
        if (((iVar3 == 0) && ((8 < val - 0x3021 && 0x51a5 < val - 0x4e00) && val != 0x3007)) &&
           (iVar3 = xmlCharInRange(val,&xmlIsDigitGroup), iVar3 == 0)) goto LAB_001c46e2;
      }
LAB_001c4703:
      pxVar6 = pxVar5;
      if ((int)uVar1 < (int)(len + 10)) {
        if ((int)uVar1 < 1) {
          uVar1 = 1;
        }
        else {
          if (49999 < uVar1) goto LAB_001c480b;
          uVar2 = uVar1 + 1 >> 1;
          bVar7 = 50000 - uVar2 < uVar1;
          uVar1 = uVar2 + uVar1;
          if (bVar7) {
            uVar1 = 50000;
          }
        }
        pxVar6 = (xmlChar *)(*xmlRealloc)(pxVar5,(size_t)uVar1);
        if (pxVar6 == (xmlChar *)0x0) goto LAB_001c480b;
      }
      if (val < 0x80) {
        lVar4 = (long)(int)len;
        len = len + 1;
        pxVar6[lVar4] = (xmlChar)val;
      }
      else {
        iVar3 = xmlCopyCharMultiByte(pxVar6 + (int)len,val);
        len = iVar3 + len;
      }
      ctxt->cur = ctxt->cur + local_b0;
      val = xmlXPathCurrentChar(ctxt,&local_b0);
      pxVar5 = pxVar6;
    } while( true );
  }
LAB_001c4817:
  xmlXPathPErrMemory(ctxt);
  return (xmlChar *)0x0;
LAB_001c480b:
  (*xmlFree)(pxVar5);
  goto LAB_001c4817;
}

Assistant:

static xmlChar *
xmlXPathParseNameComplex(xmlXPathParserContextPtr ctxt, int qualified) {
    xmlChar *ret;
    xmlChar buf[XML_MAX_NAMELEN + 5];
    int len = 0, l;
    int c;

    /*
     * Handler for more complex cases
     */
    c = CUR_CHAR(l);
    if ((c == ' ') || (c == '>') || (c == '/') || /* accelerators */
        (c == '[') || (c == ']') || (c == '@') || /* accelerators */
        (c == '*') || /* accelerators */
	(!IS_LETTER(c) && (c != '_') &&
         ((!qualified) || (c != ':')))) {
	return(NULL);
    }

    while ((c != ' ') && (c != '>') && (c != '/') && /* test bigname.xml */
	   ((IS_LETTER(c)) || (IS_DIGIT(c)) ||
            (c == '.') || (c == '-') ||
	    (c == '_') || ((qualified) && (c == ':')) ||
	    (IS_COMBINING(c)) ||
	    (IS_EXTENDER(c)))) {
	COPY_BUF(buf,len,c);
	NEXTL(l);
	c = CUR_CHAR(l);
	if (len >= XML_MAX_NAMELEN) {
	    /*
	     * Okay someone managed to make a huge name, so he's ready to pay
	     * for the processing speed.
	     */
	    xmlChar *buffer;
	    int max = len * 2;

            if (len > XML_MAX_NAME_LENGTH) {
                XP_ERRORNULL(XPATH_EXPR_ERROR);
            }
	    buffer = xmlMalloc(max);
	    if (buffer == NULL) {
                xmlXPathPErrMemory(ctxt);
                return(NULL);
	    }
	    memcpy(buffer, buf, len);
	    while ((IS_LETTER(c)) || (IS_DIGIT(c)) || /* test bigname.xml */
		   (c == '.') || (c == '-') ||
		   (c == '_') || ((qualified) && (c == ':')) ||
		   (IS_COMBINING(c)) ||
		   (IS_EXTENDER(c))) {
		if (len + 10 > max) {
                    xmlChar *tmp;
                    int newSize;

                    newSize = xmlGrowCapacity(max, 1, 1, XML_MAX_NAME_LENGTH);
                    if (newSize < 0) {
                        xmlFree(buffer);
                        xmlXPathPErrMemory(ctxt);
                        return(NULL);
                    }
		    tmp = xmlRealloc(buffer, newSize);
		    if (tmp == NULL) {
                        xmlFree(buffer);
                        xmlXPathPErrMemory(ctxt);
                        return(NULL);
		    }
                    buffer = tmp;
		    max = newSize;
		}
		COPY_BUF(buffer,len,c);
		NEXTL(l);
		c = CUR_CHAR(l);
	    }
	    buffer[len] = 0;
	    return(buffer);
	}
    }
    if (len == 0)
	return(NULL);
    ret = xmlStrndup(buf, len);
    if (ret == NULL)
        xmlXPathPErrMemory(ctxt);
    return(ret);
}